

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void Curl_conninfo_remote(Curl_easy *data,connectdata *conn,curl_socket_t sockfd)

{
  uint err;
  _Bool _Var1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  char *fmt;
  curl_socklen_t plen;
  int port;
  Curl_sockaddr_storage ssrem;
  char buffer [256];
  socklen_t local_1a0;
  int local_19c;
  sockaddr local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  char local_118 [256];
  
  local_1a0 = 0x80;
  local_198.sa_family = 0;
  local_198.sa_data[0] = '\0';
  local_198.sa_data[1] = '\0';
  local_198.sa_data[2] = '\0';
  local_198.sa_data[3] = '\0';
  local_198.sa_data[4] = '\0';
  local_198.sa_data[5] = '\0';
  local_198.sa_data[6] = '\0';
  local_198.sa_data[7] = '\0';
  local_198.sa_data[8] = '\0';
  local_198.sa_data[9] = '\0';
  local_198.sa_data[10] = '\0';
  local_198.sa_data[0xb] = '\0';
  local_198.sa_data[0xc] = '\0';
  local_198.sa_data[0xd] = '\0';
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  uStack_120 = 0;
  iVar2 = getpeername(sockfd,&local_198,&local_1a0);
  if (iVar2 == 0) {
    _Var1 = Curl_addr2string((sockaddr *)&local_198,local_1a0,conn->primary_ip,&local_19c);
    if (_Var1) {
      return;
    }
    fmt = "ssrem inet_ntop() failed with errno %d: %s";
  }
  else {
    fmt = "getpeername() failed with errno %d: %s";
  }
  puVar3 = (uint *)__errno_location();
  err = *puVar3;
  pcVar4 = Curl_strerror(err,local_118,0x100);
  Curl_failf(data,fmt,(ulong)err,pcVar4);
  return;
}

Assistant:

void Curl_conninfo_remote(struct Curl_easy *data,
                          struct connectdata *conn, curl_socket_t sockfd)
{
#ifdef HAVE_GETPEERNAME
  char buffer[STRERROR_LEN];
  struct Curl_sockaddr_storage ssrem;
  curl_socklen_t plen;
  int port;
  plen = sizeof(struct Curl_sockaddr_storage);
  memset(&ssrem, 0, sizeof(ssrem));
  if(getpeername(sockfd, (struct sockaddr*) &ssrem, &plen)) {
    int error = SOCKERRNO;
    failf(data, "getpeername() failed with errno %d: %s",
          error, Curl_strerror(error, buffer, sizeof(buffer)));
    return;
  }
  if(!Curl_addr2string((struct sockaddr*)&ssrem, plen,
                       conn->primary_ip, &port)) {
    failf(data, "ssrem inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    return;
  }
#else
  (void)data;
  (void)conn;
  (void)sockfd;
#endif
}